

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutGetCutMinLevel(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = 100000000;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar4 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar4];
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar2 = (uint *)p->vObjs->pArray[(int)fVar1];
      if (puVar2 == (uint *)0x0) {
        return uVar3;
      }
      uVar5 = *puVar2 >> 0xd;
      if (uVar5 <= uVar3) {
        uVar3 = uVar5;
      }
      uVar4 = uVar4 + 1;
    } while (*(uint *)&pCut->field_0x1c >> 0x18 != uVar4);
  }
  return uVar3;
}

Assistant:

int If_CutGetCutMinLevel( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, nMinLevel = IF_INFINITY;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nMinLevel = IF_MIN( nMinLevel, (int)pLeaf->Level );
    return nMinLevel;
}